

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHie.c
# Opt level: O2

void Abc_NtkPrintBoxInfo(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *p;
  int iVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  void *Entry;
  Vec_Int_t *p_00;
  int *__s;
  Abc_Ntk_t *pAVar5;
  Abc_Obj_t *pAVar6;
  int Fill;
  int i;
  int i_00;
  
  if ((pNtk->pDesign != (Abc_Des_t *)0x0) && (p = pNtk->pDesign->vModules, p != (Vec_Ptr_t *)0x0)) {
    if (1 < (long)p->nSize) {
      qsort(p->pArray,(long)p->nSize,8,Abc_NtkCompareNames);
    }
    iVar1 = Vec_PtrFind(p,pNtk);
    if ((iVar1 < 0) || (p->nSize <= iVar1)) {
      __assert_fail("Num >= 0 && Num < Vec_PtrSize(vMods)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                    ,0x1c3,"void Abc_NtkPrintBoxInfo(Abc_Ntk_t *)");
    }
    pvVar4 = Vec_PtrEntry(p,0);
    Entry = Vec_PtrEntry(p,iVar1);
    Vec_PtrWriteEntry(p,0,Entry);
    Vec_PtrWriteEntry(p,iVar1,pvVar4);
    iVar1 = p->nSize;
    p_00 = (Vec_Int_t *)malloc(0x10);
    iVar2 = 0x10;
    if (0xe < iVar1 - 1U) {
      iVar2 = iVar1;
    }
    p_00->nCap = iVar2;
    if (iVar2 == 0) {
      p_00->pArray = (int *)0x0;
      p_00->nSize = iVar1;
    }
    else {
      __s = (int *)malloc((long)iVar2 << 2);
      p_00->pArray = __s;
      p_00->nSize = iVar1;
      if (__s != (int *)0x0) {
        memset(__s,0,(long)iVar1 << 2);
      }
    }
    iVar2 = iVar1;
    for (i = 0; i < iVar2; i = i + 1) {
      pAVar5 = (Abc_Ntk_t *)Vec_PtrEntry(p,i);
      if (pAVar5->vBoxes->nSize != 0) {
        Vec_IntFill(p_00,iVar1,Fill);
        for (iVar1 = 0; iVar1 < pAVar5->vBoxes->nSize; iVar1 = iVar1 + 1) {
          pAVar6 = Abc_NtkBox(pAVar5,iVar1);
          if ((pAVar6->field_5).pData != (void *)0x0) {
            uVar3 = Vec_PtrFind(p,(pAVar6->field_5).pData);
            if (((int)uVar3 < 0) || (p->nSize <= (int)uVar3)) {
              __assert_fail("Num >= 0 && Num < Vec_PtrSize(vMods)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                            ,0x1d5,"void Abc_NtkPrintBoxInfo(Abc_Ntk_t *)");
            }
            if (p_00->nSize <= (int)uVar3) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
            }
            p_00->pArray[uVar3] = p_00->pArray[uVar3] + 1;
          }
        }
        printf("MODULE  ");
        printf("%-30s : ",pAVar5->pName);
        printf("PI=%6d ",(ulong)(uint)pAVar5->vPis->nSize);
        printf("PO=%6d ",(ulong)(uint)pAVar5->vPos->nSize);
        printf("BB=%6d ",(ulong)(uint)pAVar5->vBoxes->nSize);
        printf("ND=%6d ",(ulong)(uint)pAVar5->nObjCounts[7]);
        uVar3 = Abc_NtkLevel(pAVar5);
        printf("Lev=%5d ",(ulong)uVar3);
        putchar(10);
        iVar1 = p_00->nSize;
        iVar2 = 0;
        i_00 = 0;
        if (0 < iVar1) {
          iVar2 = iVar1;
          i_00 = 0;
        }
        for (; iVar2 != i_00; i_00 = i_00 + 1) {
          uVar3 = Vec_IntEntry(p_00,i_00);
          if (uVar3 != 0) {
            pvVar4 = Vec_PtrEntry(p,i_00);
            printf("%15d : %s\n",(ulong)uVar3,*(undefined8 *)((long)pvVar4 + 8));
          }
        }
      }
      iVar2 = p->nSize;
    }
    free(p_00->pArray);
    free(p_00);
    for (iVar1 = 0; iVar1 < p->nSize; iVar1 = iVar1 + 1) {
      pAVar5 = (Abc_Ntk_t *)Vec_PtrEntry(p,iVar1);
      if (pAVar5->vBoxes->nSize == 0) {
        printf("MODULE   ");
        printf("%-30s : ",pAVar5->pName);
        printf("PI=%6d ",(ulong)(uint)pAVar5->vPis->nSize);
        printf("PO=%6d ",(ulong)(uint)pAVar5->vPos->nSize);
        printf("BB=%6d ",(ulong)(uint)pAVar5->vBoxes->nSize);
        printf("ND=%6d ",(ulong)(uint)pAVar5->nObjCounts[7]);
        uVar3 = Abc_NtkLevel(pAVar5);
        printf("Lev=%5d ",(ulong)uVar3);
        putchar(10);
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkPrintBoxInfo( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vMods;
    Abc_Ntk_t * pModel, * pBoxModel;
    Abc_Obj_t * pObj;
    Vec_Int_t * vCounts;
    int i, k, Num;
    if ( pNtk->pDesign == NULL || pNtk->pDesign->vModules == NULL )
    {
//        printf( "There is no hierarchy information.\n" );
        return;
    }
    // sort models by name
    vMods = pNtk->pDesign->vModules;
    Vec_PtrSort( vMods, (int(*)())Abc_NtkCompareNames );
//    Vec_PtrForEachEntry( Abc_Ntk_t *, vMods, pModel, i )
//        printf( "%s\n", Abc_NtkName(pModel) );

    // swap the first model
    Num = Vec_PtrFind( vMods, pNtk );
    assert( Num >= 0 && Num < Vec_PtrSize(vMods) );
    pBoxModel = (Abc_Ntk_t *)Vec_PtrEntry(vMods, 0);
    Vec_PtrWriteEntry(vMods, 0, (Abc_Ntk_t *)Vec_PtrEntry(vMods, Num) );
    Vec_PtrWriteEntry(vMods, Num, pBoxModel );

    // print models
    vCounts = Vec_IntStart( Vec_PtrSize(vMods) );
    Vec_PtrForEachEntry( Abc_Ntk_t *, vMods, pModel, i )
    {
        if ( Abc_NtkBoxNum(pModel) == 0 )
            continue;
        Vec_IntFill( vCounts, Vec_IntSize(vCounts), 0 );
        Abc_NtkForEachBox( pModel, pObj, k )
        {
            pBoxModel = (Abc_Ntk_t *)pObj->pData;
            if ( pBoxModel == NULL )
                continue;
            Num = Vec_PtrFind( vMods, pBoxModel );
            assert( Num >= 0 && Num < Vec_PtrSize(vMods) );
            Vec_IntAddToEntry( vCounts, Num, 1 );
        }

//        Abc_NtkPrintStats( pModel, 0, 0, 0, 0, 0, 0, 0, 0, 0 );
        printf( "MODULE  " );
        printf( "%-30s : ", Abc_NtkName(pModel) );
        printf( "PI=%6d ", Abc_NtkPiNum(pModel) );
        printf( "PO=%6d ", Abc_NtkPoNum(pModel) );
        printf( "BB=%6d ", Abc_NtkBoxNum(pModel) );
        printf( "ND=%6d ", Abc_NtkNodeNum(pModel) ); // sans constants
        printf( "Lev=%5d ", Abc_NtkLevel(pModel) );
        printf( "\n" );

        Vec_IntForEachEntry( vCounts, Num, k )
            if ( Num )
                printf( "%15d : %s\n", Num, Abc_NtkName((Abc_Ntk_t *)Vec_PtrEntry(vMods, k)) );
    }
    Vec_IntFree( vCounts );
    Vec_PtrForEachEntry( Abc_Ntk_t *, vMods, pModel, i )
    {
        if ( Abc_NtkBoxNum(pModel) != 0 )
            continue;
        printf( "MODULE   " );
        printf( "%-30s : ", Abc_NtkName(pModel) );
        printf( "PI=%6d ", Abc_NtkPiNum(pModel) );
        printf( "PO=%6d ", Abc_NtkPoNum(pModel) );
        printf( "BB=%6d ", Abc_NtkBoxNum(pModel) );
        printf( "ND=%6d ", Abc_NtkNodeNum(pModel) );
        printf( "Lev=%5d ", Abc_NtkLevel(pModel) );
        printf( "\n" );
    }
}